

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  Geometry *pGVar21;
  long lVar22;
  RayK<4> *pRVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  float fVar31;
  undefined1 auVar36 [16];
  float fVar62;
  float fVar63;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar64;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar91;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  undefined1 local_bc1;
  size_t local_bc0;
  ulong local_bb8;
  Geometry *local_bb0;
  ulong local_ba8;
  RayK<4> *local_ba0;
  uint local_b94;
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined1 local_b70 [16];
  ulong local_b58;
  ulong local_b50;
  long local_b48;
  long local_b40;
  ulong *local_b38;
  ulong local_b30;
  ulong local_b28;
  ulong local_b20;
  ulong local_b18;
  ulong local_b10;
  ulong local_b08;
  ulong local_b00;
  long local_af8;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [32];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [16];
  undefined4 local_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined1 local_970 [16];
  uint local_960;
  uint uStack_95c;
  uint uStack_958;
  uint uStack_954;
  uint uStack_950;
  uint uStack_94c;
  uint uStack_948;
  uint uStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 *local_8e0;
  char local_8d8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  uint uStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  local_b38 = local_7f8;
  local_800 = root.ptr;
  auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar98 = ZEXT1664(auVar32);
  auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar99 = ZEXT1664(auVar32);
  auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar100 = ZEXT1664(auVar32);
  fVar88 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar31 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar62 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar88 * 0.99999964)));
  auVar101 = ZEXT1664(auVar32);
  auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar31 * 0.99999964)));
  auVar102 = ZEXT1664(auVar32);
  auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar62 * 0.99999964)));
  auVar103 = ZEXT1664(auVar32);
  fVar88 = fVar88 * 1.0000004;
  fVar31 = fVar31 * 1.0000004;
  fVar62 = fVar62 * 1.0000004;
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar26 = uVar24 ^ 0x10;
  uVar28 = uVar25 ^ 0x10;
  iVar1 = (tray->tnear).field_0.i[k];
  local_a10._4_4_ = iVar1;
  local_a10._0_4_ = iVar1;
  local_a10._8_4_ = iVar1;
  local_a10._12_4_ = iVar1;
  auVar96 = ZEXT1664(local_a10);
  iVar1 = (tray->tfar).field_0.i[k];
  local_a20._4_4_ = iVar1;
  local_a20._0_4_ = iVar1;
  local_a20._8_4_ = iVar1;
  local_a20._12_4_ = iVar1;
  auVar97 = ZEXT1664(local_a20);
  local_b00 = uVar24 >> 2;
  local_b08 = uVar26 >> 2;
  local_b10 = uVar25 >> 2;
  local_b18 = uVar28 >> 2;
  local_b20 = uVar27 >> 2;
  local_b28 = (uVar27 ^ 0x10) >> 2;
  local_a30 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  bVar30 = true;
  fVar63 = fVar88;
  fVar64 = fVar88;
  fVar65 = fVar88;
  fVar66 = fVar31;
  fVar67 = fVar31;
  fVar91 = fVar31;
  fVar92 = fVar62;
  fVar93 = fVar62;
  fVar94 = fVar62;
  local_bc0 = k;
  local_ba0 = ray;
  local_b58 = uVar25;
  local_b50 = uVar24;
  local_a00 = fVar62;
  fStack_9fc = fVar62;
  fStack_9f8 = fVar62;
  fStack_9f4 = fVar62;
  local_9f0 = fVar31;
  fStack_9ec = fVar31;
  fStack_9e8 = fVar31;
  fStack_9e4 = fVar31;
  local_9e0 = fVar88;
  fStack_9dc = fVar88;
  fStack_9d8 = fVar88;
  fStack_9d4 = fVar88;
  do {
    uVar16 = local_b38[-1];
    local_b38 = local_b38 + -1;
    while ((uVar16 & 8) == 0) {
      auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar16 + 0x20 + uVar24),auVar98._0_16_);
      auVar32 = vmulps_avx512vl(auVar101._0_16_,auVar32);
      auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar16 + 0x20 + uVar25),auVar99._0_16_);
      auVar33 = vmulps_avx512vl(auVar102._0_16_,auVar33);
      auVar32 = vmaxps_avx(auVar32,auVar33);
      auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar16 + 0x20 + uVar27),auVar100._0_16_);
      auVar33 = vmulps_avx512vl(auVar103._0_16_,auVar33);
      auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar16 + 0x20 + uVar26),auVar98._0_16_);
      auVar35._0_4_ = fVar88 * auVar34._0_4_;
      auVar35._4_4_ = fVar63 * auVar34._4_4_;
      auVar35._8_4_ = fVar64 * auVar34._8_4_;
      auVar35._12_4_ = fVar65 * auVar34._12_4_;
      auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar16 + 0x20 + uVar28),auVar99._0_16_);
      auVar75._0_4_ = fVar31 * auVar34._0_4_;
      auVar75._4_4_ = fVar66 * auVar34._4_4_;
      auVar75._8_4_ = fVar67 * auVar34._8_4_;
      auVar75._12_4_ = fVar91 * auVar34._12_4_;
      auVar34 = vminps_avx(auVar35,auVar75);
      auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar16 + 0x20 + (uVar27 ^ 0x10)),
                                auVar100._0_16_);
      auVar76._0_4_ = fVar62 * auVar35._0_4_;
      auVar76._4_4_ = fVar92 * auVar35._4_4_;
      auVar76._8_4_ = fVar93 * auVar35._8_4_;
      auVar76._12_4_ = fVar94 * auVar35._12_4_;
      auVar33 = vmaxps_avx(auVar33,auVar96._0_16_);
      auVar32 = vmaxps_avx(auVar32,auVar33);
      auVar33 = vminps_avx(auVar76,auVar97._0_16_);
      auVar33 = vminps_avx(auVar34,auVar33);
      uVar17 = vcmpps_avx512vl(auVar32,auVar33,2);
      if ((char)uVar17 == '\0') goto LAB_007011c9;
      uVar14 = uVar16 & 0xfffffffffffffff0;
      lVar15 = 0;
      for (uVar16 = uVar17; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
        lVar15 = lVar15 + 1;
      }
      uVar16 = *(ulong *)(uVar14 + lVar15 * 8);
      uVar19 = (uint)uVar17 - 1 & (uint)uVar17;
      uVar17 = (ulong)uVar19;
      if (uVar19 != 0) {
        *local_b38 = uVar16;
        lVar15 = 0;
        for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          lVar15 = lVar15 + 1;
        }
        uVar19 = uVar19 - 1 & uVar19;
        uVar17 = (ulong)uVar19;
        bVar29 = uVar19 == 0;
        while( true ) {
          local_b38 = local_b38 + 1;
          uVar16 = *(ulong *)(uVar14 + lVar15 * 8);
          if (bVar29) break;
          *local_b38 = uVar16;
          lVar15 = 0;
          for (uVar16 = uVar17; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar15 = lVar15 + 1;
          }
          uVar17 = uVar17 - 1 & uVar17;
          bVar29 = uVar17 == 0;
        }
      }
    }
    local_b40 = (ulong)((uint)uVar16 & 0xf) - 8;
    if (local_b40 != 0) {
      uVar16 = uVar16 & 0xfffffffffffffff0;
      local_b48 = 0;
      do {
        lVar15 = local_b48 * 0x58;
        local_af8 = uVar16 + lVar15;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)(uVar16 + 0x20 + lVar15);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(uVar16 + 0x24 + lVar15);
        uVar17 = vpcmpub_avx512vl(auVar32,auVar33,2);
        uVar2 = *(undefined4 *)(uVar16 + 0x38 + lVar15);
        auVar34._4_4_ = uVar2;
        auVar34._0_4_ = uVar2;
        auVar34._8_4_ = uVar2;
        auVar34._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar16 + 0x44 + lVar15);
        auVar70._4_4_ = uVar2;
        auVar70._0_4_ = uVar2;
        auVar70._8_4_ = uVar2;
        auVar70._12_4_ = uVar2;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = *(ulong *)(local_b00 + 0x20 + local_af8);
        auVar32 = vpmovzxbd_avx(auVar73);
        auVar32 = vcvtdq2ps_avx(auVar32);
        auVar33 = vfmadd213ps_fma(auVar32,auVar70,auVar34);
        auVar77._8_8_ = 0;
        auVar77._0_8_ = *(ulong *)(local_b08 + 0x20 + local_af8);
        auVar32 = vpmovzxbd_avx(auVar77);
        auVar32 = vcvtdq2ps_avx(auVar32);
        auVar34 = vfmadd213ps_fma(auVar32,auVar70,auVar34);
        uVar2 = *(undefined4 *)(uVar16 + 0x3c + lVar15);
        auVar68._4_4_ = uVar2;
        auVar68._0_4_ = uVar2;
        auVar68._8_4_ = uVar2;
        auVar68._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar16 + 0x48 + lVar15);
        auVar71._4_4_ = uVar2;
        auVar71._0_4_ = uVar2;
        auVar71._8_4_ = uVar2;
        auVar71._12_4_ = uVar2;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = *(ulong *)(local_b10 + 0x20 + local_af8);
        auVar32 = vpmovzxbd_avx(auVar80);
        auVar32 = vcvtdq2ps_avx(auVar32);
        auVar35 = vfmadd213ps_fma(auVar32,auVar71,auVar68);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)(local_b18 + 0x20 + local_af8);
        auVar32 = vpmovzxbd_avx(auVar83);
        auVar32 = vcvtdq2ps_avx(auVar32);
        auVar75 = vfmadd213ps_fma(auVar32,auVar71,auVar68);
        uVar2 = *(undefined4 *)(uVar16 + 0x40 + lVar15);
        auVar69._4_4_ = uVar2;
        auVar69._0_4_ = uVar2;
        auVar69._8_4_ = uVar2;
        auVar69._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar16 + 0x4c + lVar15);
        auVar72._4_4_ = uVar2;
        auVar72._0_4_ = uVar2;
        auVar72._8_4_ = uVar2;
        auVar72._12_4_ = uVar2;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = *(ulong *)(local_b20 + 0x20 + local_af8);
        auVar32 = vpmovzxbd_avx(auVar84);
        auVar32 = vcvtdq2ps_avx(auVar32);
        auVar76 = vfmadd213ps_fma(auVar32,auVar72,auVar69);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = *(ulong *)(local_b28 + 0x20 + local_af8);
        auVar32 = vpmovzxbd_avx(auVar86);
        auVar32 = vcvtdq2ps_avx(auVar32);
        auVar68 = vfmadd213ps_fma(auVar32,auVar72,auVar69);
        auVar32 = vsubps_avx512vl(auVar33,auVar98._0_16_);
        auVar32 = vmulps_avx512vl(auVar101._0_16_,auVar32);
        auVar33 = vsubps_avx512vl(auVar35,auVar99._0_16_);
        auVar33 = vmulps_avx512vl(auVar102._0_16_,auVar33);
        auVar32 = vmaxps_avx(auVar32,auVar33);
        auVar33 = vsubps_avx512vl(auVar76,auVar100._0_16_);
        auVar33 = vmulps_avx512vl(auVar103._0_16_,auVar33);
        auVar34 = vsubps_avx512vl(auVar34,auVar98._0_16_);
        auVar74._0_4_ = fVar88 * auVar34._0_4_;
        auVar74._4_4_ = fVar63 * auVar34._4_4_;
        auVar74._8_4_ = fVar64 * auVar34._8_4_;
        auVar74._12_4_ = fVar65 * auVar34._12_4_;
        auVar34 = vsubps_avx512vl(auVar75,auVar99._0_16_);
        auVar78._0_4_ = fVar31 * auVar34._0_4_;
        auVar78._4_4_ = fVar66 * auVar34._4_4_;
        auVar78._8_4_ = fVar67 * auVar34._8_4_;
        auVar78._12_4_ = fVar91 * auVar34._12_4_;
        auVar34 = vminps_avx(auVar74,auVar78);
        auVar35 = vsubps_avx512vl(auVar68,auVar100._0_16_);
        auVar79._0_4_ = fVar62 * auVar35._0_4_;
        auVar79._4_4_ = fVar92 * auVar35._4_4_;
        auVar79._8_4_ = fVar93 * auVar35._8_4_;
        auVar79._12_4_ = fVar94 * auVar35._12_4_;
        auVar33 = vmaxps_avx(auVar33,auVar96._0_16_);
        auVar32 = vmaxps_avx(auVar32,auVar33);
        auVar33 = vminps_avx(auVar79,auVar97._0_16_);
        auVar33 = vminps_avx(auVar34,auVar33);
        local_b30 = vcmpps_avx512vl(auVar32,auVar33,2);
        local_b30 = uVar17 & 0xff & local_b30;
        if ((char)local_b30 != '\0') {
          do {
            lVar15 = 0;
            for (uVar24 = local_b30; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar15 = lVar15 + 1;
            }
            uVar3 = *(ushort *)(local_af8 + lVar15 * 8);
            uVar4 = *(ushort *)(local_af8 + 2 + lVar15 * 8);
            pGVar21 = (context->scene->geometries).items[*(uint *)(local_af8 + 0x50)].ptr;
            lVar5 = *(long *)&pGVar21->field_0x58;
            lVar22 = pGVar21[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     (ulong)*(uint *)(local_af8 + 4 + lVar15 * 8);
            local_b94 = uVar4 & 0x7fff;
            uVar19 = *(uint *)(lVar5 + 4 + lVar22);
            uVar25 = (ulong)uVar19;
            uVar17 = (ulong)(uVar19 * local_b94 + *(int *)(lVar5 + lVar22) + (uVar3 & 0x7fff));
            lVar15 = *(long *)&pGVar21[1].time_range.upper;
            p_Var6 = pGVar21[1].intersectionFilterN;
            auVar32 = *(undefined1 (*) [16])(lVar15 + (uVar17 + 1) * (long)p_Var6);
            auVar33 = *(undefined1 (*) [16])(lVar15 + (uVar17 + uVar25) * (long)p_Var6);
            lVar18 = uVar17 + uVar25 + 1;
            auVar34 = *(undefined1 (*) [16])(lVar15 + lVar18 * (long)p_Var6);
            uVar24 = (ulong)(-1 < (short)uVar3);
            auVar35 = *(undefined1 (*) [16])(lVar15 + (uVar17 + uVar24 + 1) * (long)p_Var6);
            lVar20 = uVar24 + lVar18;
            auVar75 = *(undefined1 (*) [16])(lVar15 + lVar20 * (long)p_Var6);
            uVar24 = 0;
            if (-1 < (short)uVar4) {
              uVar24 = uVar25;
            }
            auVar76 = *(undefined1 (*) [16])(lVar15 + (uVar17 + uVar25 + uVar24) * (long)p_Var6);
            auVar68 = *(undefined1 (*) [16])(lVar15 + (lVar18 + uVar24) * (long)p_Var6);
            auVar46._16_16_ = *(undefined1 (*) [16])(lVar15 + (uVar24 + lVar20) * (long)p_Var6);
            auVar46._0_16_ = auVar34;
            auVar70 = vunpcklps_avx(auVar32,auVar75);
            auVar69 = vunpckhps_avx(auVar32,auVar75);
            auVar71 = vunpcklps_avx(auVar35,auVar34);
            auVar35 = vunpckhps_avx(auVar35,auVar34);
            auVar72 = vunpcklps_avx(auVar69,auVar35);
            auVar73 = vunpcklps_avx(auVar70,auVar71);
            auVar35 = vunpckhps_avx(auVar70,auVar71);
            auVar70 = vunpcklps_avx(auVar33,auVar68);
            auVar69 = vunpckhps_avx(auVar33,auVar68);
            auVar71 = vunpcklps_avx(auVar34,auVar76);
            auVar76 = vunpckhps_avx(auVar34,auVar76);
            auVar69 = vunpcklps_avx(auVar69,auVar76);
            auVar74 = vunpcklps_avx(auVar70,auVar71);
            auVar76 = vunpckhps_avx(auVar70,auVar71);
            auVar43._16_16_ = auVar68;
            auVar43._0_16_ = auVar33;
            auVar41._16_16_ = auVar75;
            auVar41._0_16_ = auVar32;
            auVar61 = vunpcklps_avx(auVar41,auVar43);
            auVar38._16_16_ = auVar34;
            auVar38._0_16_ = *(undefined1 (*) [16])(lVar15 + (long)p_Var6 * uVar17);
            auVar60 = vunpcklps_avx(auVar38,auVar46);
            auVar57 = vunpcklps_avx(auVar60,auVar61);
            auVar60 = vunpckhps_avx(auVar60,auVar61);
            auVar61 = vunpckhps_avx(auVar41,auVar43);
            auVar56 = vunpckhps_avx(auVar38,auVar46);
            auVar56 = vunpcklps_avx(auVar56,auVar61);
            auVar42._16_16_ = auVar73;
            auVar42._0_16_ = auVar73;
            auVar44._16_16_ = auVar35;
            auVar44._0_16_ = auVar35;
            auVar45._16_16_ = auVar72;
            auVar45._0_16_ = auVar72;
            auVar47._16_16_ = auVar74;
            auVar47._0_16_ = auVar74;
            auVar49._16_16_ = auVar76;
            auVar49._0_16_ = auVar76;
            uVar2 = *(undefined4 *)(local_ba0 + local_bc0 * 4);
            auVar50._4_4_ = uVar2;
            auVar50._0_4_ = uVar2;
            auVar50._8_4_ = uVar2;
            auVar50._12_4_ = uVar2;
            auVar50._16_4_ = uVar2;
            auVar50._20_4_ = uVar2;
            auVar50._24_4_ = uVar2;
            auVar50._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(local_ba0 + local_bc0 * 4 + 0x10);
            auVar51._4_4_ = uVar2;
            auVar51._0_4_ = uVar2;
            auVar51._8_4_ = uVar2;
            auVar51._12_4_ = uVar2;
            auVar51._16_4_ = uVar2;
            auVar51._20_4_ = uVar2;
            auVar51._24_4_ = uVar2;
            auVar51._28_4_ = uVar2;
            auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_ba0 + local_bc0 * 4 + 0x20)));
            uVar2 = *(undefined4 *)(local_ba0 + local_bc0 * 4 + 0x40);
            auVar85._4_4_ = uVar2;
            auVar85._0_4_ = uVar2;
            auVar85._8_4_ = uVar2;
            auVar85._12_4_ = uVar2;
            auVar85._16_4_ = uVar2;
            auVar85._20_4_ = uVar2;
            auVar85._24_4_ = uVar2;
            auVar85._28_4_ = uVar2;
            auVar48._16_16_ = auVar69;
            auVar48._0_16_ = auVar69;
            uVar2 = *(undefined4 *)(local_ba0 + local_bc0 * 4 + 0x50);
            auVar89._4_4_ = uVar2;
            auVar89._0_4_ = uVar2;
            auVar89._8_4_ = uVar2;
            auVar89._12_4_ = uVar2;
            auVar89._16_4_ = uVar2;
            auVar89._20_4_ = uVar2;
            auVar89._24_4_ = uVar2;
            auVar89._28_4_ = uVar2;
            fVar88 = *(float *)(local_ba0 + local_bc0 * 4 + 0x60);
            auVar95._4_4_ = fVar88;
            auVar95._0_4_ = fVar88;
            auVar95._8_4_ = fVar88;
            auVar95._12_4_ = fVar88;
            auVar95._16_4_ = fVar88;
            auVar95._20_4_ = fVar88;
            auVar95._24_4_ = fVar88;
            auVar95._28_4_ = fVar88;
            auVar61 = vsubps_avx(auVar57,auVar50);
            auVar60 = vsubps_avx(auVar60,auVar51);
            auVar38 = vsubps_avx512vl(auVar56,auVar37);
            auVar56 = vsubps_avx(auVar42,auVar50);
            auVar57 = vsubps_avx(auVar44,auVar51);
            auVar39 = vsubps_avx512vl(auVar45,auVar37);
            auVar40 = vsubps_avx512vl(auVar47,auVar50);
            auVar41 = vsubps_avx512vl(auVar49,auVar51);
            auVar42 = vsubps_avx512vl(auVar48,auVar37);
            auVar43 = vsubps_avx512vl(auVar40,auVar61);
            auVar44 = vsubps_avx512vl(auVar41,auVar60);
            auVar45 = vsubps_avx512vl(auVar42,auVar38);
            auVar46 = vsubps_avx512vl(auVar61,auVar56);
            auVar47 = vsubps_avx512vl(auVar60,auVar57);
            auVar48 = vsubps_avx512vl(auVar38,auVar39);
            auVar49 = vsubps_avx512vl(auVar56,auVar40);
            auVar50 = vsubps_avx512vl(auVar57,auVar41);
            auVar51 = vsubps_avx512vl(auVar39,auVar42);
            auVar52 = vaddps_avx512vl(auVar40,auVar61);
            auVar53 = vaddps_avx512vl(auVar41,auVar60);
            auVar37 = vaddps_avx512vl(auVar42,auVar38);
            auVar54 = vmulps_avx512vl(auVar53,auVar45);
            auVar54 = vfmsub231ps_avx512vl(auVar54,auVar44,auVar37);
            auVar37 = vmulps_avx512vl(auVar37,auVar43);
            auVar55 = vfmsub231ps_avx512vl(auVar37,auVar45,auVar52);
            auVar37._4_4_ = auVar52._4_4_ * auVar44._4_4_;
            auVar37._0_4_ = auVar52._0_4_ * auVar44._0_4_;
            auVar37._8_4_ = auVar52._8_4_ * auVar44._8_4_;
            auVar37._12_4_ = auVar52._12_4_ * auVar44._12_4_;
            auVar37._16_4_ = auVar52._16_4_ * auVar44._16_4_;
            auVar37._20_4_ = auVar52._20_4_ * auVar44._20_4_;
            auVar37._24_4_ = auVar52._24_4_ * auVar44._24_4_;
            auVar37._28_4_ = auVar52._28_4_;
            auVar32 = vfmsub231ps_fma(auVar37,auVar43,auVar53);
            auVar53._0_4_ = auVar32._0_4_ * fVar88;
            auVar53._4_4_ = auVar32._4_4_ * fVar88;
            auVar53._8_4_ = auVar32._8_4_ * fVar88;
            auVar53._12_4_ = auVar32._12_4_ * fVar88;
            auVar53._16_4_ = fVar88 * 0.0;
            auVar53._20_4_ = fVar88 * 0.0;
            auVar53._24_4_ = fVar88 * 0.0;
            auVar53._28_4_ = 0;
            auVar37 = vfmadd231ps_avx512vl(auVar53,auVar89,auVar55);
            auVar37 = vfmadd231ps_avx512vl(auVar37,auVar85,auVar54);
            auVar55._0_4_ = auVar61._0_4_ + auVar56._0_4_;
            auVar55._4_4_ = auVar61._4_4_ + auVar56._4_4_;
            auVar55._8_4_ = auVar61._8_4_ + auVar56._8_4_;
            auVar55._12_4_ = auVar61._12_4_ + auVar56._12_4_;
            auVar55._16_4_ = auVar61._16_4_ + auVar56._16_4_;
            auVar55._20_4_ = auVar61._20_4_ + auVar56._20_4_;
            auVar55._24_4_ = auVar61._24_4_ + auVar56._24_4_;
            auVar55._28_4_ = auVar61._28_4_ + auVar56._28_4_;
            auVar52 = vaddps_avx512vl(auVar60,auVar57);
            auVar53 = vaddps_avx512vl(auVar38,auVar39);
            auVar54 = vmulps_avx512vl(auVar52,auVar48);
            auVar54 = vfmsub231ps_avx512vl(auVar54,auVar47,auVar53);
            auVar53 = vmulps_avx512vl(auVar53,auVar46);
            auVar53 = vfmsub231ps_avx512vl(auVar53,auVar48,auVar55);
            auVar55 = vmulps_avx512vl(auVar55,auVar47);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar46,auVar52);
            auVar52._4_4_ = auVar55._4_4_ * fVar88;
            auVar52._0_4_ = auVar55._0_4_ * fVar88;
            auVar52._8_4_ = auVar55._8_4_ * fVar88;
            auVar52._12_4_ = auVar55._12_4_ * fVar88;
            auVar52._16_4_ = auVar55._16_4_ * fVar88;
            auVar52._20_4_ = auVar55._20_4_ * fVar88;
            auVar52._24_4_ = auVar55._24_4_ * fVar88;
            auVar52._28_4_ = auVar55._28_4_;
            auVar52 = vfmadd231ps_avx512vl(auVar52,auVar89,auVar53);
            auVar52 = vfmadd231ps_avx512vl(auVar52,auVar85,auVar54);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar56 = vaddps_avx512vl(auVar56,auVar40);
            auVar57 = vaddps_avx512vl(auVar57,auVar41);
            auVar39 = vaddps_avx512vl(auVar39,auVar42);
            auVar40 = vmulps_avx512vl(auVar57,auVar51);
            auVar40 = vfmsub231ps_avx512vl(auVar40,auVar50,auVar39);
            auVar39 = vmulps_avx512vl(auVar39,auVar49);
            auVar41 = vfmsub231ps_avx512vl(auVar39,auVar51,auVar56);
            auVar39._4_4_ = auVar56._4_4_ * auVar50._4_4_;
            auVar39._0_4_ = auVar56._0_4_ * auVar50._0_4_;
            auVar39._8_4_ = auVar56._8_4_ * auVar50._8_4_;
            auVar39._12_4_ = auVar56._12_4_ * auVar50._12_4_;
            auVar39._16_4_ = auVar56._16_4_ * auVar50._16_4_;
            auVar39._20_4_ = auVar56._20_4_ * auVar50._20_4_;
            auVar39._24_4_ = auVar56._24_4_ * auVar50._24_4_;
            auVar39._28_4_ = auVar56._28_4_;
            auVar32 = vfmsub231ps_fma(auVar39,auVar49,auVar57);
            auVar56 = vmulps_avx512vl(ZEXT1632(auVar32),auVar95);
            auVar56 = vfmadd231ps_avx512vl(auVar56,auVar89,auVar41);
            auVar39 = vfmadd231ps_avx512vl(auVar56,auVar85,auVar40);
            auVar40._0_4_ = auVar37._0_4_ + auVar52._0_4_;
            auVar40._4_4_ = auVar37._4_4_ + auVar52._4_4_;
            auVar40._8_4_ = auVar37._8_4_ + auVar52._8_4_;
            auVar40._12_4_ = auVar37._12_4_ + auVar52._12_4_;
            auVar40._16_4_ = auVar37._16_4_ + auVar52._16_4_;
            auVar40._20_4_ = auVar37._20_4_ + auVar52._20_4_;
            auVar40._24_4_ = auVar37._24_4_ + auVar52._24_4_;
            auVar40._28_4_ = auVar37._28_4_ + auVar52._28_4_;
            local_900 = vaddps_avx512vl(auVar39,auVar40);
            vandps_avx512vl(local_900,auVar53);
            auVar56._8_4_ = 0x34000000;
            auVar56._0_8_ = 0x3400000034000000;
            auVar56._12_4_ = 0x34000000;
            auVar56._16_4_ = 0x34000000;
            auVar56._20_4_ = 0x34000000;
            auVar56._24_4_ = 0x34000000;
            auVar56._28_4_ = 0x34000000;
            auVar56 = vmulps_avx512vl(local_900,auVar56);
            auVar57 = vminps_avx512vl(auVar37,auVar52);
            auVar40 = vminps_avx512vl(auVar57,auVar39);
            auVar57._8_4_ = 0x80000000;
            auVar57._0_8_ = 0x8000000080000000;
            auVar57._12_4_ = 0x80000000;
            auVar57._16_4_ = 0x80000000;
            auVar57._20_4_ = 0x80000000;
            auVar57._24_4_ = 0x80000000;
            auVar57._28_4_ = 0x80000000;
            auVar57 = vxorps_avx512vl(auVar56,auVar57);
            uVar7 = vcmpps_avx512vl(auVar40,auVar57,5);
            auVar57 = vmaxps_avx512vl(auVar37,auVar52);
            auVar57 = vmaxps_avx512vl(auVar57,auVar39);
            uVar8 = vcmpps_avx512vl(auVar57,auVar56,2);
            bVar9 = (byte)uVar7 | (byte)uVar8;
            if (bVar9 != 0) {
              auVar56 = vmulps_avx512vl(auVar47,auVar45);
              auVar57 = vmulps_avx512vl(auVar43,auVar48);
              auVar39 = vmulps_avx512vl(auVar46,auVar44);
              auVar40 = vmulps_avx512vl(auVar50,auVar48);
              auVar41 = vmulps_avx512vl(auVar46,auVar51);
              auVar42 = vmulps_avx512vl(auVar49,auVar47);
              auVar44 = vfmsub213ps_avx512vl(auVar44,auVar48,auVar56);
              auVar45 = vfmsub213ps_avx512vl(auVar45,auVar46,auVar57);
              auVar43 = vfmsub213ps_avx512vl(auVar43,auVar47,auVar39);
              auVar47 = vfmsub213ps_avx512vl(auVar51,auVar47,auVar40);
              auVar48 = vfmsub213ps_avx512vl(auVar49,auVar48,auVar41);
              auVar46 = vfmsub213ps_avx512vl(auVar50,auVar46,auVar42);
              vandps_avx512vl(auVar56,auVar53);
              vandps_avx512vl(auVar40,auVar53);
              uVar24 = vcmpps_avx512vl(auVar46,auVar46,1);
              vandps_avx512vl(auVar57,auVar53);
              vandps_avx512vl(auVar41,auVar53);
              uVar25 = vcmpps_avx512vl(auVar46,auVar46,1);
              vandps_avx512vl(auVar39,auVar53);
              vandps_avx512vl(auVar42,auVar53);
              uVar17 = vcmpps_avx512vl(auVar46,auVar46,1);
              bVar29 = (bool)((byte)uVar24 & 1);
              auVar58._0_4_ = (float)((uint)bVar29 * auVar44._0_4_ | (uint)!bVar29 * auVar47._0_4_);
              bVar29 = (bool)((byte)(uVar24 >> 1) & 1);
              auVar58._4_4_ = (float)((uint)bVar29 * auVar44._4_4_ | (uint)!bVar29 * auVar47._4_4_);
              bVar29 = (bool)((byte)(uVar24 >> 2) & 1);
              auVar58._8_4_ = (float)((uint)bVar29 * auVar44._8_4_ | (uint)!bVar29 * auVar47._8_4_);
              bVar29 = (bool)((byte)(uVar24 >> 3) & 1);
              auVar58._12_4_ =
                   (float)((uint)bVar29 * auVar44._12_4_ | (uint)!bVar29 * auVar47._12_4_);
              bVar29 = (bool)((byte)(uVar24 >> 4) & 1);
              auVar58._16_4_ =
                   (float)((uint)bVar29 * auVar44._16_4_ | (uint)!bVar29 * auVar47._16_4_);
              bVar29 = (bool)((byte)(uVar24 >> 5) & 1);
              auVar58._20_4_ =
                   (float)((uint)bVar29 * auVar44._20_4_ | (uint)!bVar29 * auVar47._20_4_);
              bVar29 = (bool)((byte)(uVar24 >> 6) & 1);
              auVar58._24_4_ =
                   (float)((uint)bVar29 * auVar44._24_4_ | (uint)!bVar29 * auVar47._24_4_);
              bVar29 = SUB81(uVar24 >> 7,0);
              auVar58._28_4_ = (uint)bVar29 * auVar44._28_4_ | (uint)!bVar29 * auVar47._28_4_;
              bVar29 = (bool)((byte)uVar25 & 1);
              auVar59._0_4_ = (float)((uint)bVar29 * auVar45._0_4_ | (uint)!bVar29 * auVar48._0_4_);
              bVar29 = (bool)((byte)(uVar25 >> 1) & 1);
              auVar59._4_4_ = (float)((uint)bVar29 * auVar45._4_4_ | (uint)!bVar29 * auVar48._4_4_);
              bVar29 = (bool)((byte)(uVar25 >> 2) & 1);
              auVar59._8_4_ = (float)((uint)bVar29 * auVar45._8_4_ | (uint)!bVar29 * auVar48._8_4_);
              bVar29 = (bool)((byte)(uVar25 >> 3) & 1);
              auVar59._12_4_ =
                   (float)((uint)bVar29 * auVar45._12_4_ | (uint)!bVar29 * auVar48._12_4_);
              bVar29 = (bool)((byte)(uVar25 >> 4) & 1);
              auVar59._16_4_ =
                   (float)((uint)bVar29 * auVar45._16_4_ | (uint)!bVar29 * auVar48._16_4_);
              bVar29 = (bool)((byte)(uVar25 >> 5) & 1);
              auVar59._20_4_ =
                   (float)((uint)bVar29 * auVar45._20_4_ | (uint)!bVar29 * auVar48._20_4_);
              bVar29 = (bool)((byte)(uVar25 >> 6) & 1);
              auVar59._24_4_ =
                   (float)((uint)bVar29 * auVar45._24_4_ | (uint)!bVar29 * auVar48._24_4_);
              bVar29 = SUB81(uVar25 >> 7,0);
              auVar59._28_4_ = (uint)bVar29 * auVar45._28_4_ | (uint)!bVar29 * auVar48._28_4_;
              bVar29 = (bool)((byte)uVar17 & 1);
              fVar31 = (float)((uint)bVar29 * auVar43._0_4_ | (uint)!bVar29 * auVar46._0_4_);
              bVar29 = (bool)((byte)(uVar17 >> 1) & 1);
              fVar62 = (float)((uint)bVar29 * auVar43._4_4_ | (uint)!bVar29 * auVar46._4_4_);
              bVar29 = (bool)((byte)(uVar17 >> 2) & 1);
              fVar63 = (float)((uint)bVar29 * auVar43._8_4_ | (uint)!bVar29 * auVar46._8_4_);
              bVar29 = (bool)((byte)(uVar17 >> 3) & 1);
              fVar64 = (float)((uint)bVar29 * auVar43._12_4_ | (uint)!bVar29 * auVar46._12_4_);
              bVar29 = (bool)((byte)(uVar17 >> 4) & 1);
              fVar65 = (float)((uint)bVar29 * auVar43._16_4_ | (uint)!bVar29 * auVar46._16_4_);
              bVar29 = (bool)((byte)(uVar17 >> 5) & 1);
              fVar66 = (float)((uint)bVar29 * auVar43._20_4_ | (uint)!bVar29 * auVar46._20_4_);
              bVar29 = (bool)((byte)(uVar17 >> 6) & 1);
              fVar67 = (float)((uint)bVar29 * auVar43._24_4_ | (uint)!bVar29 * auVar46._24_4_);
              bVar29 = SUB81(uVar17 >> 7,0);
              auVar54._4_4_ = fVar88 * fVar62;
              auVar54._0_4_ = fVar88 * fVar31;
              auVar54._8_4_ = fVar88 * fVar63;
              auVar54._12_4_ = fVar88 * fVar64;
              auVar54._16_4_ = fVar88 * fVar65;
              auVar54._20_4_ = fVar88 * fVar66;
              auVar54._24_4_ = fVar88 * fVar67;
              auVar54._28_4_ = fVar88;
              auVar32 = vfmadd213ps_fma(auVar89,auVar59,auVar54);
              auVar32 = vfmadd213ps_fma(auVar85,auVar58,ZEXT1632(auVar32));
              auVar56 = ZEXT1632(CONCAT412(auVar32._12_4_ + auVar32._12_4_,
                                           CONCAT48(auVar32._8_4_ + auVar32._8_4_,
                                                    CONCAT44(auVar32._4_4_ + auVar32._4_4_,
                                                             auVar32._0_4_ + auVar32._0_4_))));
              auVar90._0_4_ = auVar38._0_4_ * fVar31;
              auVar90._4_4_ = auVar38._4_4_ * fVar62;
              auVar90._8_4_ = auVar38._8_4_ * fVar63;
              auVar90._12_4_ = auVar38._12_4_ * fVar64;
              auVar90._16_4_ = auVar38._16_4_ * fVar65;
              auVar90._20_4_ = auVar38._20_4_ * fVar66;
              auVar90._24_4_ = auVar38._24_4_ * fVar67;
              auVar90._28_4_ = 0;
              auVar32 = vfmadd213ps_fma(auVar60,auVar59,auVar90);
              auVar33 = vfmadd213ps_fma(auVar61,auVar58,ZEXT1632(auVar32));
              auVar60 = vrcp14ps_avx512vl(auVar56);
              auVar61._8_4_ = 0x3f800000;
              auVar61._0_8_ = 0x3f8000003f800000;
              auVar61._12_4_ = 0x3f800000;
              auVar61._16_4_ = 0x3f800000;
              auVar61._20_4_ = 0x3f800000;
              auVar61._24_4_ = 0x3f800000;
              auVar61._28_4_ = 0x3f800000;
              auVar61 = vfnmadd213ps_avx512vl(auVar60,auVar56,auVar61);
              auVar32 = vfmadd132ps_fma(auVar61,auVar60,auVar60);
              uVar2 = *(undefined4 *)(local_ba0 + local_bc0 * 4 + 0x80);
              local_a60._4_4_ = uVar2;
              local_a60._0_4_ = uVar2;
              local_a60._8_4_ = uVar2;
              local_a60._12_4_ = uVar2;
              local_a60._16_4_ = uVar2;
              local_a60._20_4_ = uVar2;
              local_a60._24_4_ = uVar2;
              local_a60._28_4_ = uVar2;
              auVar96 = ZEXT3264(local_a60);
              local_880 = ZEXT1632(CONCAT412(auVar32._12_4_ * (auVar33._12_4_ + auVar33._12_4_),
                                             CONCAT48(auVar32._8_4_ *
                                                      (auVar33._8_4_ + auVar33._8_4_),
                                                      CONCAT44(auVar32._4_4_ *
                                                               (auVar33._4_4_ + auVar33._4_4_),
                                                               auVar32._0_4_ *
                                                               (auVar33._0_4_ + auVar33._0_4_)))));
              uVar7 = vcmpps_avx512vl(local_880,local_a60,2);
              uVar2 = *(undefined4 *)(local_ba0 + local_bc0 * 4 + 0x30);
              auVar60._4_4_ = uVar2;
              auVar60._0_4_ = uVar2;
              auVar60._8_4_ = uVar2;
              auVar60._12_4_ = uVar2;
              auVar60._16_4_ = uVar2;
              auVar60._20_4_ = uVar2;
              auVar60._24_4_ = uVar2;
              auVar60._28_4_ = uVar2;
              uVar8 = vcmpps_avx512vl(local_880,auVar60,0xd);
              bVar9 = (byte)uVar7 & (byte)uVar8 & bVar9;
              if (bVar9 != 0) {
                local_bb8 = vcmpps_avx512vl(auVar56,_DAT_01faff00,4);
                local_bb8 = bVar9 & local_bb8;
                local_8d8 = (char)local_bb8;
                if (local_8d8 != '\0') {
                  local_8e0 = &local_bc1;
                  auVar61 = vsubps_avx(local_900,auVar52);
                  local_940 = vblendps_avx(auVar37,auVar61,0xf0);
                  auVar61 = vsubps_avx(local_900,auVar37);
                  local_920 = vblendps_avx(auVar52,auVar61,0xf0);
                  local_860[0] = auVar58._0_4_ * 1.0;
                  local_860[1] = auVar58._4_4_ * 1.0;
                  local_860[2] = auVar58._8_4_ * 1.0;
                  local_860[3] = auVar58._12_4_ * 1.0;
                  fStack_850 = auVar58._16_4_ * -1.0;
                  fStack_84c = auVar58._20_4_ * -1.0;
                  fStack_848 = auVar58._24_4_ * -1.0;
                  uStack_844 = auVar58._28_4_;
                  local_840._4_4_ = auVar59._4_4_ * 1.0;
                  local_840._0_4_ = auVar59._0_4_ * 1.0;
                  local_840._8_4_ = auVar59._8_4_ * 1.0;
                  local_840._12_4_ = auVar59._12_4_ * 1.0;
                  local_840._16_4_ = auVar59._16_4_ * -1.0;
                  local_840._20_4_ = auVar59._20_4_ * -1.0;
                  local_840._24_4_ = auVar59._24_4_ * -1.0;
                  local_840._28_4_ = auVar59._28_4_;
                  local_820._4_4_ = fVar62 * 1.0;
                  local_820._0_4_ = fVar31 * 1.0;
                  local_820._8_4_ = fVar63 * 1.0;
                  local_820._12_4_ = fVar64 * 1.0;
                  local_820._16_4_ = fVar65 * -1.0;
                  local_820._20_4_ = fVar66 * -1.0;
                  local_820._24_4_ = fVar67 * -1.0;
                  local_820._28_4_ = (uint)bVar29 * auVar43._28_4_ | (uint)!bVar29 * auVar46._28_4_;
                  pGVar21 = (context->scene->geometries).items[*(uint *)(local_af8 + 0x50)].ptr;
                  if ((pGVar21->mask & *(uint *)(local_ba0 + local_bc0 * 4 + 0x90)) != 0) {
                    pRVar23 = local_ba0;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_007011df:
                      *(undefined4 *)(pRVar23 + local_bc0 * 4 + 0x80) = 0xff800000;
                      return bVar30;
                    }
                    auVar61 = vpbroadcastd_avx512vl();
                    auVar61 = vpaddd_avx2(auVar61,_DAT_01fec4a0);
                    auVar60 = vpbroadcastd_avx512vl();
                    auVar60 = vpaddd_avx2(auVar60,_DAT_01fec4c0);
                    auVar81._0_4_ = (float)(int)(*(ushort *)(lVar5 + 8 + lVar22) - 1);
                    auVar81._4_12_ = auVar37._4_12_;
                    auVar13._12_4_ = 0;
                    auVar13._0_12_ = ZEXT812(0);
                    auVar33 = vrcp14ss_avx512f(auVar13 << 0x20,ZEXT416((uint)auVar81._0_4_));
                    auVar32 = vfnmadd213ss_fma(auVar81,auVar33,SUB6416(ZEXT464(0x40000000),0));
                    fVar67 = auVar33._0_4_ * auVar32._0_4_;
                    auVar87._0_4_ = (float)(int)(*(ushort *)(lVar5 + 10 + lVar22) - 1);
                    auVar87._4_12_ = auVar37._4_12_;
                    auVar33 = vrcp14ss_avx512f(auVar13 << 0x20,ZEXT416((uint)auVar87._0_4_));
                    auVar32 = vfnmadd213ss_fma(auVar87,auVar33,SUB6416(ZEXT464(0x40000000),0));
                    fVar91 = auVar33._0_4_ * auVar32._0_4_;
                    auVar61 = vcvtdq2ps_avx(auVar61);
                    auVar60 = vcvtdq2ps_avx(auVar60);
                    auVar10._8_4_ = 0x219392ef;
                    auVar10._0_8_ = 0x219392ef219392ef;
                    auVar10._12_4_ = 0x219392ef;
                    auVar10._16_4_ = 0x219392ef;
                    auVar10._20_4_ = 0x219392ef;
                    auVar10._24_4_ = 0x219392ef;
                    auVar10._28_4_ = 0x219392ef;
                    uVar24 = vcmpps_avx512vl(local_900,auVar10,5);
                    auVar56 = vrcp14ps_avx512vl(local_900);
                    auVar82._8_4_ = 0x3f800000;
                    auVar82._0_8_ = 0x3f8000003f800000;
                    auVar82._12_4_ = 0x3f800000;
                    auVar82._16_4_ = 0x3f800000;
                    auVar82._20_4_ = 0x3f800000;
                    auVar82._24_4_ = 0x3f800000;
                    auVar82._28_4_ = 0x3f800000;
                    auVar32 = vfnmadd213ps_fma(local_900,auVar56,auVar82);
                    auVar57 = vfmadd132ps_avx512vl(ZEXT1632(auVar32),auVar56,auVar56);
                    fVar66 = (float)((uint)((byte)uVar24 & 1) * auVar57._0_4_);
                    fVar65 = (float)((uint)((byte)(uVar24 >> 1) & 1) * auVar57._4_4_);
                    fVar64 = (float)((uint)((byte)(uVar24 >> 2) & 1) * auVar57._8_4_);
                    fVar63 = (float)((uint)((byte)(uVar24 >> 3) & 1) * auVar57._12_4_);
                    fVar62 = (float)((uint)((byte)(uVar24 >> 4) & 1) * auVar57._16_4_);
                    fVar31 = (float)((uint)((byte)(uVar24 >> 5) & 1) * auVar57._20_4_);
                    fVar88 = (float)((uint)((byte)(uVar24 >> 6) & 1) * auVar57._24_4_);
                    auVar11._4_4_ =
                         (local_900._4_4_ * auVar61._4_4_ + local_940._4_4_) * fVar67 * fVar65;
                    auVar11._0_4_ =
                         (local_900._0_4_ * auVar61._0_4_ + local_940._0_4_) * fVar67 * fVar66;
                    auVar11._8_4_ =
                         (local_900._8_4_ * auVar61._8_4_ + local_940._8_4_) * fVar67 * fVar64;
                    auVar11._12_4_ =
                         (local_900._12_4_ * auVar61._12_4_ + local_940._12_4_) * fVar67 * fVar63;
                    auVar11._16_4_ =
                         (local_900._16_4_ * auVar61._16_4_ + local_940._16_4_) * fVar67 * fVar62;
                    auVar11._20_4_ =
                         (local_900._20_4_ * auVar61._20_4_ + local_940._20_4_) * fVar67 * fVar31;
                    auVar11._24_4_ =
                         (local_900._24_4_ * auVar61._24_4_ + local_940._24_4_) * fVar67 * fVar88;
                    auVar11._28_4_ = auVar56._28_4_;
                    local_8c0 = vminps_avx(auVar11,auVar82);
                    auVar12._4_4_ =
                         (local_900._4_4_ * auVar60._4_4_ + local_920._4_4_) * fVar91 * fVar65;
                    auVar12._0_4_ =
                         (local_900._0_4_ * auVar60._0_4_ + local_920._0_4_) * fVar91 * fVar66;
                    auVar12._8_4_ =
                         (local_900._8_4_ * auVar60._8_4_ + local_920._8_4_) * fVar91 * fVar64;
                    auVar12._12_4_ =
                         (local_900._12_4_ * auVar60._12_4_ + local_920._12_4_) * fVar91 * fVar63;
                    auVar12._16_4_ =
                         (local_900._16_4_ * auVar60._16_4_ + local_920._16_4_) * fVar91 * fVar62;
                    auVar12._20_4_ =
                         (local_900._20_4_ * auVar60._20_4_ + local_920._20_4_) * fVar91 * fVar31;
                    auVar12._24_4_ =
                         (local_900._24_4_ * auVar60._24_4_ + local_920._24_4_) * fVar91 * fVar88;
                    auVar12._28_4_ = (uint)(byte)(uVar24 >> 7) * auVar57._28_4_;
                    local_8a0 = vminps_avx(auVar12,auVar82);
                    local_ba8 = 0;
                    for (uVar24 = local_bb8; (uVar24 & 1) == 0;
                        uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                      local_ba8 = local_ba8 + 1;
                    }
                    local_b80 = vpbroadcastd_avx512vl();
                    local_b90 = vpbroadcastd_avx512vl();
                    local_aa0 = auVar98._0_16_;
                    local_ab0 = auVar99._0_16_;
                    local_ac0 = auVar100._0_16_;
                    local_ad0 = auVar101._0_16_;
                    local_ae0 = auVar102._0_16_;
                    local_af0 = auVar103._0_16_;
                    local_bb0 = pGVar21;
                    do {
                      uVar2 = *(undefined4 *)(local_8c0 + local_ba8 * 4);
                      local_9a0._4_4_ = uVar2;
                      local_9a0._0_4_ = uVar2;
                      local_9a0._8_4_ = uVar2;
                      local_9a0._12_4_ = uVar2;
                      uVar2 = *(undefined4 *)(local_8a0 + local_ba8 * 4);
                      local_990._4_4_ = uVar2;
                      local_990._0_4_ = uVar2;
                      local_990._8_4_ = uVar2;
                      local_990._12_4_ = uVar2;
                      *(float *)(pRVar23 + local_bc0 * 4 + 0x80) = local_860[local_ba8 - 8];
                      local_a90.context = context->user;
                      local_9d0 = local_860[local_ba8];
                      uVar2 = *(undefined4 *)(local_840 + local_ba8 * 4);
                      local_9c0._4_4_ = uVar2;
                      local_9c0._0_4_ = uVar2;
                      local_9c0._8_4_ = uVar2;
                      local_9c0._12_4_ = uVar2;
                      local_9b0 = *(undefined4 *)(local_820 + local_ba8 * 4);
                      local_980 = local_b90._0_8_;
                      uStack_978 = local_b90._8_8_;
                      local_970 = local_b80;
                      vpcmpeqd_avx2(ZEXT1632(local_b80),ZEXT1632(local_b80));
                      uStack_95c = (local_a90.context)->instID[0];
                      local_960 = uStack_95c;
                      uStack_958 = uStack_95c;
                      uStack_954 = uStack_95c;
                      uStack_950 = (local_a90.context)->instPrimID[0];
                      uStack_94c = uStack_950;
                      uStack_948 = uStack_950;
                      uStack_944 = uStack_950;
                      local_b70 = local_a30;
                      local_a90.valid = (int *)local_b70;
                      local_a90.geometryUserPtr = pGVar21->userPtr;
                      local_a90.hit = (RTCHitN *)&local_9d0;
                      local_a90.N = 4;
                      local_a90.ray = (RTCRayN *)pRVar23;
                      fStack_9cc = local_9d0;
                      fStack_9c8 = local_9d0;
                      fStack_9c4 = local_9d0;
                      uStack_9ac = local_9b0;
                      uStack_9a8 = local_9b0;
                      uStack_9a4 = local_9b0;
                      if (pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar21->occlusionFilterN)(&local_a90);
                        auVar96 = ZEXT3264(local_a60);
                        auVar103 = ZEXT1664(local_af0);
                        auVar102 = ZEXT1664(local_ae0);
                        auVar101 = ZEXT1664(local_ad0);
                        auVar100 = ZEXT1664(local_ac0);
                        auVar99 = ZEXT1664(local_ab0);
                        auVar98 = ZEXT1664(local_aa0);
                        pGVar21 = local_bb0;
                        pRVar23 = local_ba0;
                      }
                      uVar24 = vptestmd_avx512vl(local_b70,local_b70);
                      if ((uVar24 & 0xf) != 0) {
                        p_Var6 = context->args->filter;
                        if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var6)(&local_a90);
                          auVar96 = ZEXT3264(local_a60);
                          auVar103 = ZEXT1664(local_af0);
                          auVar102 = ZEXT1664(local_ae0);
                          auVar101 = ZEXT1664(local_ad0);
                          auVar100 = ZEXT1664(local_ac0);
                          auVar99 = ZEXT1664(local_ab0);
                          auVar98 = ZEXT1664(local_aa0);
                          pGVar21 = local_bb0;
                          pRVar23 = local_ba0;
                        }
                        auVar32 = *(undefined1 (*) [16])(local_a90.ray + 0x80);
                        uVar24 = vptestmd_avx512vl(local_b70,local_b70);
                        uVar24 = uVar24 & 0xf;
                        auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar29 = (bool)((byte)uVar24 & 1);
                        auVar36._0_4_ = (uint)bVar29 * auVar33._0_4_ | (uint)!bVar29 * auVar32._0_4_
                        ;
                        bVar29 = (bool)((byte)(uVar24 >> 1) & 1);
                        auVar36._4_4_ = (uint)bVar29 * auVar33._4_4_ | (uint)!bVar29 * auVar32._4_4_
                        ;
                        bVar29 = (bool)((byte)(uVar24 >> 2) & 1);
                        auVar36._8_4_ = (uint)bVar29 * auVar33._8_4_ | (uint)!bVar29 * auVar32._8_4_
                        ;
                        bVar29 = SUB81(uVar24 >> 3,0);
                        auVar36._12_4_ =
                             (uint)bVar29 * auVar33._12_4_ | (uint)!bVar29 * auVar32._12_4_;
                        *(undefined1 (*) [16])(local_a90.ray + 0x80) = auVar36;
                        if ((byte)uVar24 != 0) goto LAB_007011df;
                      }
                      *(int *)(pRVar23 + local_bc0 * 4 + 0x80) = auVar96._0_4_;
                      uVar24 = local_ba8 & 0x3f;
                      local_ba8 = 0;
                      local_bb8 = local_bb8 ^ 1L << uVar24;
                      for (uVar24 = local_bb8; (uVar24 & 1) == 0;
                          uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                        local_ba8 = local_ba8 + 1;
                      }
                    } while (local_bb8 != 0);
                  }
                }
              }
            }
            local_b30 = local_b30 - 1 & local_b30;
            auVar96 = ZEXT1664(local_a10);
            auVar97 = ZEXT1664(local_a20);
            uVar24 = local_b50;
            uVar25 = local_b58;
            fVar88 = local_9e0;
            fVar63 = fStack_9dc;
            fVar64 = fStack_9d8;
            fVar65 = fStack_9d4;
            fVar31 = local_9f0;
            fVar66 = fStack_9ec;
            fVar67 = fStack_9e8;
            fVar91 = fStack_9e4;
            fVar62 = local_a00;
            fVar92 = fStack_9fc;
            fVar93 = fStack_9f8;
            fVar94 = fStack_9f4;
          } while (local_b30 != 0);
        }
        local_b48 = local_b48 + 1;
      } while (local_b48 != local_b40);
    }
LAB_007011c9:
    bVar30 = local_b38 != &local_800;
    if (!bVar30) {
      return bVar30;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }